

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O0

void csrTest(int dim)

{
  int iVar1;
  bool bVar2;
  Matrix *pMVar3;
  CSR *this;
  Matrix *this_00;
  Matrix *this_01;
  CSR *this_02;
  TriangularSolve *this_03;
  Matrix *this_04;
  Matrix *this_05;
  ostream *poVar4;
  bool r2;
  Matrix *rs3;
  Matrix *result;
  TriangularSolve *rs;
  CSR *c2;
  Matrix *vector;
  Matrix *reg;
  CSR *c1;
  string local_a8;
  Matrix *local_88;
  Matrix *spr;
  string local_78;
  Matrix *local_58;
  Matrix *rhs;
  allocator local_39;
  string local_38;
  Matrix *local_18;
  Matrix *mtxL;
  int dim_local;
  
  mtxL._4_4_ = dim;
  pMVar3 = (Matrix *)operator_new(0x30);
  iVar1 = mtxL._4_4_;
  rhs._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Lower Triangular",&local_39);
  Matrix::Matrix(pMVar3,iVar1,iVar1,&local_38);
  rhs._3_1_ = 0;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pMVar3;
  Matrix::Random(pMVar3);
  Matrix::LowerTriangular(local_18);
  pMVar3 = (Matrix *)operator_new(0x30);
  iVar1 = mtxL._4_4_;
  spr._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"rhs",(allocator *)((long)&spr + 7));
  Matrix::Matrix(pMVar3,iVar1,1,&local_78);
  spr._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&spr + 7));
  local_58 = pMVar3;
  Matrix::Random(pMVar3);
  pMVar3 = (Matrix *)operator_new(0x30);
  iVar1 = mtxL._4_4_;
  c1._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"Sparse Matrix:",(allocator *)((long)&c1 + 7));
  Matrix::Matrix(pMVar3,iVar1,iVar1,&local_a8);
  c1._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c1 + 7));
  local_88 = pMVar3;
  Matrix::Random(pMVar3,mtxL._4_4_);
  this = (CSR *)operator_new(0x30);
  CSR::CSR(this,local_88);
  CSR::triplet(this);
  this_00 = CSR::turnToRegular(this);
  this_01 = CSR::csrMult(this);
  this_02 = (CSR *)operator_new(0x30);
  CSR::CSR(this_02,local_18);
  this_03 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_03,mtxL._4_4_);
  this_04 = TriangularSolve::solve(this_03,this_02,local_58);
  Matrix::print(this_04);
  this_05 = CSR::csrMult(this_02,this_04);
  bVar2 = Matrix::isequal(this_05,local_58);
  poVar4 = std::operator<<((ostream *)&std::cout,"the result of Triangular solve is: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar2);
  std::operator<<(poVar4,"\n");
  pMVar3 = local_18;
  if (local_18 != (Matrix *)0x0) {
    Matrix::~Matrix(local_18);
    operator_delete(pMVar3,0x30);
  }
  pMVar3 = local_58;
  if (local_58 != (Matrix *)0x0) {
    Matrix::~Matrix(local_58);
    operator_delete(pMVar3,0x30);
  }
  pMVar3 = local_88;
  if (local_88 != (Matrix *)0x0) {
    Matrix::~Matrix(local_88);
    operator_delete(pMVar3,0x30);
  }
  if (this != (CSR *)0x0) {
    CSR::~CSR(this);
    operator_delete(this,0x30);
  }
  if (this_00 != (Matrix *)0x0) {
    Matrix::~Matrix(this_00);
    operator_delete(this_00,0x30);
  }
  if (this_01 != (Matrix *)0x0) {
    Matrix::~Matrix(this_01);
    operator_delete(this_01,0x30);
  }
  if (this_02 != (CSR *)0x0) {
    CSR::~CSR(this_02);
    operator_delete(this_02,0x30);
  }
  if (this_03 != (TriangularSolve *)0x0) {
    TriangularSolve::~TriangularSolve(this_03);
    operator_delete(this_03,4);
  }
  if (this_05 != (Matrix *)0x0) {
    Matrix::~Matrix(this_05);
    operator_delete(this_05,0x30);
  }
  if (this_04 != (Matrix *)0x0) {
    Matrix::~Matrix(this_04);
    operator_delete(this_04,0x30);
  }
  return;
}

Assistant:

void  csrTest(int dim)
{
    Matrix *mtxL = new Matrix(dim,dim,"Lower Triangular");
    mtxL->Random();
    mtxL->LowerTriangular();

    Matrix *rhs = new Matrix(dim, 1, "rhs");
    rhs->Random();

    //CSR print & mult
    Matrix *spr = new Matrix(dim,dim, "Sparse Matrix:");
    spr->Random(dim);
    //   spr->print();
    //save matrix in csr format
    CSR *c1 = new CSR(spr);
    c1->triplet();
    Matrix *reg =  c1->turnToRegular();
    //  reg->print();

    Matrix *vector = c1->csrMult();
    // vector->print();

    //csrSolve
    //  mtxL->print();
    //  rhs->print();
    CSR *c2 = new CSR(mtxL);
    TriangularSolve *rs = new TriangularSolve(dim);
    Matrix *result = rs->solve(c2,rhs);
    result->print();

    //csr Solve,Test the equation(c2*y=rhs)
    Matrix *rs3 = c2->csrMult(result);
    //   rs3->print();
    bool r2 = rs3->isequal(rhs);
    cout<<"the result of Triangular solve is: "<<r2 <<"\n";

    delete mtxL;
    delete rhs;
    delete spr;
    delete c1;
    delete reg;
    delete vector;
    delete c2;
    delete rs;
    delete rs3;
    delete result;
}